

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_bool32 ma_channel_map_is_valid(ma_channel *pChannelMap,ma_uint32 channels)

{
  ma_channel mVar1;
  ulong uVar2;
  
  if (channels != 0) {
    if (channels != 1) {
      uVar2 = 0;
      do {
        if (pChannelMap == (ma_channel *)0x0) {
          mVar1 = ma_channel_map_init_standard_channel
                            (ma_standard_channel_map_default,channels,(ma_uint32)uVar2);
        }
        else {
          mVar1 = pChannelMap[uVar2];
        }
        if (mVar1 == '\x01') {
          return 0;
        }
        uVar2 = uVar2 + 1;
      } while (channels != uVar2);
    }
    channels = 1;
  }
  return channels;
}

Assistant:

MA_API ma_bool32 ma_channel_map_is_valid(const ma_channel* pChannelMap, ma_uint32 channels)
{
    /* A channel count of 0 is invalid. */
    if (channels == 0) {
        return MA_FALSE;
    }

    /* It does not make sense to have a mono channel when there is more than 1 channel. */
    if (channels > 1) {
        ma_uint32 iChannel;
        for (iChannel = 0; iChannel < channels; ++iChannel) {
            if (ma_channel_map_get_channel(pChannelMap, channels, iChannel) == MA_CHANNEL_MONO) {
                return MA_FALSE;
            }
        }
    }

    return MA_TRUE;
}